

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::internalCompile(SelectionCompiler *this)

{
  bool bVar1;
  undefined4 uVar2;
  size_type sVar3;
  long in_RDI;
  int tok;
  Token *pToken;
  Token token;
  string ident;
  int val;
  float value;
  string str;
  bool endOfLine;
  int tokCommand;
  Token tokenCommand;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> ltoken;
  undefined4 in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe0c;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  undefined1 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe11;
  undefined1 in_stack_fffffffffffffe12;
  undefined1 in_stack_fffffffffffffe13;
  uint in_stack_fffffffffffffe14;
  SelectionCompiler *in_stack_fffffffffffffe18;
  SelectionCompiler *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe48;
  uint uVar4;
  SelectionCompiler *in_stack_fffffffffffffe50;
  uint local_180;
  undefined1 in_stack_fffffffffffffe97;
  SelectionCompiler *in_stack_fffffffffffffe98;
  string local_120 [36];
  int local_fc;
  string local_d0 [36];
  float local_ac;
  string local_80 [32];
  int local_60;
  int local_5c;
  byte local_55;
  uint local_44;
  string *in_stack_ffffffffffffffc0;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> local_28;
  byte local_1;
  
  uVar2 = std::__cxx11::string::size();
  *(undefined4 *)(in_RDI + 0xd0) = uVar2;
  *(undefined4 *)(in_RDI + 0xd8) = 0;
  *(undefined2 *)(in_RDI + 0xd4) = 1;
  *(undefined1 *)(in_RDI + 0x88) = 0;
  std::
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ::clear((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
           *)0x3fdd53);
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::vector
            ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)0x3fdd60);
  Token::Token((Token *)0x3fdd6d);
  local_44 = 0;
  do {
    bVar1 = lookingAtLeadingWhitespace(in_stack_fffffffffffffe20);
    if (!bVar1) {
      local_55 = lookingAtEndOfLine(in_stack_fffffffffffffe18);
      if (((bool)local_55) ||
         (bVar1 = lookingAtEndOfStatement
                            ((SelectionCompiler *)
                             CONCAT17(in_stack_fffffffffffffe0f,
                                      CONCAT16(in_stack_fffffffffffffe0e,
                                               CONCAT24(in_stack_fffffffffffffe0c,
                                                        in_stack_fffffffffffffe08)))), bVar1)) {
        if (local_44 != 0) {
          bVar1 = compileCommand((SelectionCompiler *)
                                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                 (vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
                                 in_stack_fffffffffffffe20);
          if (!bVar1) {
            local_1 = 0;
            local_5c = 1;
            goto LAB_003fe691;
          }
          std::
          vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
          ::push_back((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                       *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
          local_60 = (int)*(short *)(in_RDI + 0xd4);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffe14,
                              CONCAT13(in_stack_fffffffffffffe13,
                                       CONCAT12(in_stack_fffffffffffffe12,
                                                CONCAT11(in_stack_fffffffffffffe11,
                                                         in_stack_fffffffffffffe10)))),
                     (value_type_conflict1 *)
                     CONCAT17(in_stack_fffffffffffffe0f,
                              CONCAT16(in_stack_fffffffffffffe0e,
                                       CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                                      )));
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe20,
                     (value_type_conflict1 *)in_stack_fffffffffffffe18);
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::clear
                    ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)0x3fdeb1);
          local_44 = 0;
        }
        if (*(int *)(in_RDI + 0xd0) <= *(int *)(in_RDI + 0xd8)) {
          local_1 = 1;
          local_5c = 1;
          goto LAB_003fe691;
        }
        if ((local_55 & 1) != 0) {
          *(short *)(in_RDI + 0xd4) = *(short *)(in_RDI + 0xd4) + 1;
        }
      }
      else if (local_44 == 0) {
LAB_003fe2de:
        bVar1 = lookingAtLookupToken
                          ((SelectionCompiler *)
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        in_stack_fffffffffffffe28 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe28);
        if (!bVar1) {
          bVar1 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::empty
                            ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
                             in_stack_fffffffffffffe20);
          if (bVar1) {
            local_1 = commandExpected(in_stack_fffffffffffffe50);
            local_5c = 1;
          }
          else {
            local_1 = unrecognizedToken(in_stack_fffffffffffffe50);
            local_5c = 1;
          }
LAB_003fe691:
          Token::~Token((Token *)0x3fe69e);
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector
                    ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
                     in_stack_fffffffffffffe20);
          return (bool)(local_1 & 1);
        }
        std::__cxx11::string::substr((ulong)&stack0xfffffffffffffe98,in_RDI + 0x20);
        Token::Token((Token *)0x3fe32e);
        in_stack_fffffffffffffe20 = (SelectionCompiler *)TokenMap::getInstance();
        in_stack_fffffffffffffe18 =
             (SelectionCompiler *)
             TokenMap::getToken((TokenMap *)
                                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                (string *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        if (in_stack_fffffffffffffe18 == (SelectionCompiler *)0x0) {
          std::any::
          any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                    ((any *)CONCAT44(in_stack_fffffffffffffe14,
                                     CONCAT13(in_stack_fffffffffffffe13,
                                              CONCAT12(in_stack_fffffffffffffe12,
                                                       CONCAT11(in_stack_fffffffffffffe11,
                                                                in_stack_fffffffffffffe10)))),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe0f,
                              CONCAT16(in_stack_fffffffffffffe0e,
                                       CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                                      )));
          Token::Token((Token *)CONCAT44(in_stack_fffffffffffffe14,
                                         CONCAT13(in_stack_fffffffffffffe13,
                                                  CONCAT12(in_stack_fffffffffffffe12,
                                                           CONCAT11(in_stack_fffffffffffffe11,
                                                                    in_stack_fffffffffffffe10)))),
                       CONCAT13(in_stack_fffffffffffffe0f,
                                CONCAT12(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe0c)),
                       (any *)0x3fe3bc);
          Token::operator=((Token *)CONCAT44(in_stack_fffffffffffffe14,
                                             CONCAT13(in_stack_fffffffffffffe13,
                                                      CONCAT12(in_stack_fffffffffffffe12,
                                                               CONCAT11(in_stack_fffffffffffffe11,
                                                                        in_stack_fffffffffffffe10)))
                                            ),
                           (Token *)CONCAT17(in_stack_fffffffffffffe0f,
                                             CONCAT16(in_stack_fffffffffffffe0e,
                                                      CONCAT24(in_stack_fffffffffffffe0c,
                                                               in_stack_fffffffffffffe08))));
          Token::~Token((Token *)0x3fe3d7);
          std::any::~any((any *)0x3fe3e1);
        }
        else {
          Token::operator=((Token *)CONCAT44(in_stack_fffffffffffffe14,
                                             CONCAT13(in_stack_fffffffffffffe13,
                                                      CONCAT12(in_stack_fffffffffffffe12,
                                                               CONCAT11(in_stack_fffffffffffffe11,
                                                                        in_stack_fffffffffffffe10)))
                                            ),
                           (Token *)CONCAT17(in_stack_fffffffffffffe0f,
                                             CONCAT16(in_stack_fffffffffffffe0e,
                                                      CONCAT24(in_stack_fffffffffffffe0c,
                                                               in_stack_fffffffffffffe08))));
        }
        in_stack_fffffffffffffe14 = local_44;
        if (local_44 == 0) {
          *(undefined4 *)(in_RDI + 0xf8) = *(undefined4 *)(in_RDI + 0xd8);
          local_44 = local_180;
          if ((local_180 & 0x100) != 0) goto LAB_003fe594;
          in_stack_fffffffffffffe13 = commandExpected(in_stack_fffffffffffffe50);
          local_5c = 1;
          local_1 = in_stack_fffffffffffffe13;
        }
        else if (local_44 == 0x301) {
          uVar4 = local_180;
          sVar3 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::size(&local_28);
          if (sVar3 == 1) {
            if ((uVar4 == 1) || ((uVar4 & 0x4400) == 0x4400)) {
LAB_003fe594:
              std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                        ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
                         in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
              local_5c = 4;
            }
            else {
              in_stack_fffffffffffffe12 =
                   invalidExpressionToken
                             (in_stack_fffffffffffffe50,
                              (string *)CONCAT44(uVar4,in_stack_fffffffffffffe48));
              local_5c = 1;
              local_1 = in_stack_fffffffffffffe12;
            }
          }
          else {
            if ((uVar4 == 1) || ((uVar4 & 0x4400) != 0)) goto LAB_003fe594;
            in_stack_fffffffffffffe11 =
                 invalidExpressionToken
                           (in_stack_fffffffffffffe50,
                            (string *)CONCAT44(uVar4,in_stack_fffffffffffffe48));
            local_5c = 1;
            local_1 = in_stack_fffffffffffffe11;
          }
        }
        else {
          if (((local_44 != 0x302) || (local_180 == 1)) || ((local_180 & 0x400) != 0))
          goto LAB_003fe594;
          in_stack_fffffffffffffe10 =
               invalidExpressionToken
                         (in_stack_fffffffffffffe50,
                          (string *)CONCAT44(local_180,in_stack_fffffffffffffe48));
          local_5c = 1;
          local_1 = in_stack_fffffffffffffe10;
        }
        Token::~Token((Token *)0x3fe5bd);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
        if (local_5c != 4) goto LAB_003fe691;
      }
      else {
        bVar1 = lookingAtString(in_stack_fffffffffffffe18);
        if (bVar1) {
          getUnescapedStringLiteral_abi_cxx11_(in_stack_fffffffffffffe98);
          std::any::
          any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                    ((any *)CONCAT44(in_stack_fffffffffffffe14,
                                     CONCAT13(in_stack_fffffffffffffe13,
                                              CONCAT12(in_stack_fffffffffffffe12,
                                                       CONCAT11(in_stack_fffffffffffffe11,
                                                                in_stack_fffffffffffffe10)))),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe0f,
                              CONCAT16(in_stack_fffffffffffffe0e,
                                       CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                                      )));
          Token::Token((Token *)CONCAT44(in_stack_fffffffffffffe14,
                                         CONCAT13(in_stack_fffffffffffffe13,
                                                  CONCAT12(in_stack_fffffffffffffe12,
                                                           CONCAT11(in_stack_fffffffffffffe11,
                                                                    in_stack_fffffffffffffe10)))),
                       CONCAT13(in_stack_fffffffffffffe0f,
                                CONCAT12(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe0c)),
                       (any *)0x3fdf6a);
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                    ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
                     CONCAT44(in_stack_fffffffffffffe14,
                              CONCAT13(in_stack_fffffffffffffe13,
                                       CONCAT12(in_stack_fffffffffffffe12,
                                                CONCAT11(in_stack_fffffffffffffe11,
                                                         in_stack_fffffffffffffe10)))),
                     (value_type *)
                     CONCAT17(in_stack_fffffffffffffe0f,
                              CONCAT16(in_stack_fffffffffffffe0e,
                                       CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                                      )));
          Token::~Token((Token *)0x3fdf90);
          std::any::~any((any *)0x3fdf9d);
          local_5c = 4;
          std::__cxx11::string::~string(local_80);
        }
        else {
          bVar1 = lookingAtDecimal((SelectionCompiler *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                   SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0));
          if (bVar1) {
            std::__cxx11::string::substr((ulong)local_d0,in_RDI + 0x20);
            in_stack_fffffffffffffe34 = lexi_cast<float>(in_stack_ffffffffffffffc0);
            std::__cxx11::string::~string(local_d0);
            local_ac = in_stack_fffffffffffffe34;
            std::any::any<float&,float,std::any::_Manager_internal<float>,void>
                      ((any *)CONCAT44(in_stack_fffffffffffffe14,
                                       CONCAT13(in_stack_fffffffffffffe13,
                                                CONCAT12(in_stack_fffffffffffffe12,
                                                         CONCAT11(in_stack_fffffffffffffe11,
                                                                  in_stack_fffffffffffffe10)))),
                       (float *)CONCAT17(in_stack_fffffffffffffe0f,
                                         CONCAT16(in_stack_fffffffffffffe0e,
                                                  CONCAT24(in_stack_fffffffffffffe0c,
                                                           in_stack_fffffffffffffe08))));
            Token::Token((Token *)CONCAT44(in_stack_fffffffffffffe14,
                                           CONCAT13(in_stack_fffffffffffffe13,
                                                    CONCAT12(in_stack_fffffffffffffe12,
                                                             CONCAT11(in_stack_fffffffffffffe11,
                                                                      in_stack_fffffffffffffe10)))),
                         CONCAT13(in_stack_fffffffffffffe0f,
                                  CONCAT12(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe0c)),
                         (any *)0x3fe0dd);
            std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                      ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
                       CONCAT44(in_stack_fffffffffffffe14,
                                CONCAT13(in_stack_fffffffffffffe13,
                                         CONCAT12(in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10)))),
                       (value_type *)
                       CONCAT17(in_stack_fffffffffffffe0f,
                                CONCAT16(in_stack_fffffffffffffe0e,
                                         CONCAT24(in_stack_fffffffffffffe0c,
                                                  in_stack_fffffffffffffe08))));
            Token::~Token((Token *)0x3fe103);
            std::any::~any((any *)0x3fe110);
          }
          else {
            bVar1 = lookingAtInteger(in_stack_fffffffffffffe98,(bool)in_stack_fffffffffffffe97);
            in_stack_fffffffffffffe30 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe30);
            if (!bVar1) goto LAB_003fe2de;
            std::__cxx11::string::substr((ulong)local_120,in_RDI + 0x20);
            in_stack_fffffffffffffe2c = lexi_cast<int>(in_stack_ffffffffffffffc0);
            std::__cxx11::string::~string(local_120);
            local_fc = in_stack_fffffffffffffe2c;
            std::any::any<int&,int,std::any::_Manager_internal<int>,void>
                      ((any *)CONCAT44(in_stack_fffffffffffffe14,
                                       CONCAT13(in_stack_fffffffffffffe13,
                                                CONCAT12(in_stack_fffffffffffffe12,
                                                         CONCAT11(in_stack_fffffffffffffe11,
                                                                  in_stack_fffffffffffffe10)))),
                       (int *)CONCAT17(in_stack_fffffffffffffe0f,
                                       CONCAT16(in_stack_fffffffffffffe0e,
                                                CONCAT24(in_stack_fffffffffffffe0c,
                                                         in_stack_fffffffffffffe08))));
            Token::Token((Token *)CONCAT44(in_stack_fffffffffffffe14,
                                           CONCAT13(in_stack_fffffffffffffe13,
                                                    CONCAT12(in_stack_fffffffffffffe12,
                                                             CONCAT11(in_stack_fffffffffffffe11,
                                                                      in_stack_fffffffffffffe10)))),
                         CONCAT13(in_stack_fffffffffffffe0f,
                                  CONCAT12(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe0c)),
                         (any *)0x3fe235);
            std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                      ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
                       CONCAT44(in_stack_fffffffffffffe14,
                                CONCAT13(in_stack_fffffffffffffe13,
                                         CONCAT12(in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10)))),
                       (value_type *)
                       CONCAT17(in_stack_fffffffffffffe0f,
                                CONCAT16(in_stack_fffffffffffffe0e,
                                         CONCAT24(in_stack_fffffffffffffe0c,
                                                  in_stack_fffffffffffffe08))));
            Token::~Token((Token *)0x3fe25b);
            std::any::~any((any *)0x3fe268);
          }
        }
      }
    }
    *(int *)(in_RDI + 0xd8) = *(int *)(in_RDI + 0xdc) + *(int *)(in_RDI + 0xd8);
  } while( true );
}

Assistant:

bool SelectionCompiler::internalCompile() {
    cchScript   = script.size();
    ichToken    = 0;
    lineCurrent = 1;

    error = false;

    // std::vector<Token> lltoken;
    aatokenCompiled.clear();
    std::vector<Token> ltoken;

    Token tokenCommand;
    int tokCommand = Token::nada;

    for (; true; ichToken += cchToken) {
      if (lookingAtLeadingWhitespace()) continue;
      // if (lookingAtComment())
      //    continue;
      bool endOfLine = lookingAtEndOfLine();
      if (endOfLine || lookingAtEndOfStatement()) {
        if (tokCommand != Token::nada) {
          if (!compileCommand(ltoken)) { return false; }
          aatokenCompiled.push_back(atokenCommand);
          lineNumbers.push_back(lineCurrent);
          lineIndices.push_back(ichCurrentCommand);
          ltoken.clear();
          tokCommand = Token::nada;
        }

        if (ichToken < cchScript) {
          if (endOfLine) ++lineCurrent;
          continue;
        }
        break;
      }

      if (tokCommand != Token::nada) {
        if (lookingAtString()) {
          std::string str = getUnescapedStringLiteral();
          ltoken.push_back(Token(Token::string, str));
          continue;
        }
        // if ((tokCommand & Token::specialstring) != 0 &&
        //    lookingAtSpecialString()) {
        //    std::string str = script.substr(ichToken, ichToken + cchToken);
        //    ltoken.push_back(Token(Token::string, str));
        //    continue;
        //}
        // if (lookingAtDecimal((tokCommand & Token::negnums) != 0)) {
        if (lookingAtDecimal((tokCommand) != 0)) {
          float value = lexi_cast<float>(script.substr(ichToken, cchToken));
          ltoken.push_back(Token(Token::decimal, std::any(value)));
          continue;
        }
        // if (lookingAtInteger((tokCommand & Token::negnums) != 0)) {
        if (lookingAtInteger((tokCommand) != 0)) {
          int val = lexi_cast<int>(script.substr(ichToken, cchToken));
          ltoken.push_back(Token(Token::integer, std::any(val)));
          continue;
        }
      }

      if (lookingAtLookupToken()) {
        std::string ident = script.substr(ichToken, cchToken);
        Token token;
        Token* pToken = TokenMap::getInstance().getToken(ident);
        if (pToken != NULL) {
          token = *pToken;
        } else {
          token = Token(Token::identifier, ident);
        }

        int tok = token.tok;

        switch (tokCommand) {
        case Token::nada:
          ichCurrentCommand = ichToken;
          // tokenCommand = token;
          tokCommand = tok;
          if ((tokCommand & Token::command) == 0) return commandExpected();
          break;

        case Token::define:
          if (ltoken.size() == 1) {
            // we are looking at the variable name
            if (tok != Token::identifier &&
                (tok & Token::predefinedset) != Token::predefinedset)
              return invalidExpressionToken(ident);
          } else {
            // we are looking at the expression
            if (tok != Token::identifier &&
                (tok & (Token::expression | Token::predefinedset)) == 0)
              return invalidExpressionToken(ident);
          }

          break;

        case Token::select:
          if (tok != Token::identifier && (tok & Token::expression) == 0)
            return invalidExpressionToken(ident);
          break;
        }
        ltoken.push_back(token);
        continue;
      }

      if (ltoken.empty()) { return commandExpected(); }

      return unrecognizedToken();
    }

    return true;
  }